

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O3

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_ini_file *ini,char *part_name,xr_ogf_v3 *ogf)

{
  char *pcVar1;
  size_t __n;
  xr_bone *pxVar2;
  undefined8 uVar3;
  size_t lindex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *bone_name;
  allocator<char> local_71;
  char *local_70;
  string local_68;
  char *local_48;
  xr_ogf_v3 *local_40;
  xr_ini_file *local_38;
  
  local_40 = ogf;
  local_38 = ini;
  __n = xr_ini_file::line_count(ini,part_name);
  if (__n == 0) {
    msg("empty partition section %s",part_name);
  }
  else {
    pcVar1 = (char *)(this->super_xr_partition).m_name._M_string_length;
    strlen(part_name);
    lindex = 0;
    local_48 = part_name;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_xr_partition).m_name,0,pcVar1,(ulong)part_name);
    this_00 = &(this->super_xr_partition).m_bones;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(this_00,__n);
    while( true ) {
      xr_ini_file::r_line(local_38,local_48,lindex,&local_70,(char **)0x0);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,local_70,&local_71);
      pxVar2 = xr_object::find_bone((xr_object *)local_40,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (pxVar2 == (xr_bone *)0x0) break;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,local_70,&local_71);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 &local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      lindex = lindex + 1;
      if (__n == lindex) {
        return;
      }
    }
    msg("unknown bone %s in partition %s",local_70,local_48);
  }
  uVar3 = __cxa_allocate_exception(1);
  __cxa_throw(uVar3,&xr_error::typeinfo,0);
}

Assistant:

inline void xr_ogf_v3::partition_io::import(const xr_ini_file& ini, const char* part_name, xr_ogf_v3& ogf)
{
	size_t num_bones = ini.line_count(part_name);
	if (num_bones == 0) {
		msg("empty partition section %s", part_name);
		throw xr_error();
	}

	m_name = part_name;
	m_bones.reserve(num_bones);
	for (size_t i = 0; i != num_bones; ++i) {
		const char* bone_name;
		ini.r_line(part_name, i, &bone_name, 0);
		if (ogf.find_bone(bone_name) == 0) {
			msg("unknown bone %s in partition %s", bone_name, part_name);
			throw xr_error();
		}
		m_bones.push_back(bone_name);
	}
}